

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O2

void player_kill_monster(monster_conflict *mon,player *p,char *note)

{
  monster_base *pmVar1;
  _Bool _Var2;
  monster_lore *lore;
  monster_base *pmVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  wchar_t mode;
  uint type;
  char *fmt;
  char m_name [80];
  char unique_name [80];
  char buf [80];
  
  lore = get_lore(mon->race);
  mode = (uint)(note != (char *)0x0) << 9;
  monster_desc(m_name,0x50,(monster *)mon,mode);
  if (mon->original_race != (monster_race *)0x0) {
    monster_revert_shape(mon);
    lore = get_lore(mon->race);
    monster_desc(m_name,0x50,(monster *)mon,mode);
  }
  _Var2 = monster_is_unique((monster *)mon);
  if (_Var2) {
    pmVar1 = mon->race->base;
    pmVar3 = lookup_monster_base("Morgoth");
    type = pmVar1 == pmVar3 | 0x94;
  }
  else {
    type = 6;
  }
  if (note == (char *)0x0) {
    notice_stuff(p);
    _Var2 = monster_is_visible((monster *)mon);
    if (_Var2) {
      _Var2 = monster_is_destroyed((monster *)mon);
      if (_Var2) {
        fmt = "You have destroyed %s.";
      }
      else {
        fmt = "You have slain %s.";
      }
    }
    else {
      fmt = "You have killed %s.";
    }
    msgt(type,fmt,m_name);
  }
  else {
    sVar4 = strlen(note);
    if (1 < sVar4) {
      notice_stuff(p);
      my_strcap(m_name);
      msgt(type,"%s%s",m_name,note);
    }
  }
  lVar6 = (long)p->lev;
  lVar5 = (long)mon->race->level * (long)mon->race->mexp;
  lVar7 = (ulong)p->exp_frac + (lVar5 % lVar6 << 0x10) / lVar6;
  p->exp_frac = (uint16_t)lVar7;
  _Var2 = monster_is_unique((monster *)mon);
  if (_Var2) {
    if (mon->original_race != (monster_race *)0x0) {
      __assert_fail("mon->original_race == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-util.c"
                    ,0x441,
                    "void player_kill_monster(struct monster *, struct player *, const char *)");
    }
    mon->race->max_num = '\0';
    monster_desc(unique_name,0x50,(monster *)mon,L'\x88');
    strnfmt(buf,0x50,"Killed %s");
    history_add(p,buf,L'\x06');
  }
  player_exp_gain(p,(uint)(0xffff < (int)lVar7) + (int)(lVar5 / lVar6));
  monster_death(mon,p,false);
  if (p->timed[0x31] != 0) {
    player_inc_timed(p,L'1',L'\n',false,false,true);
    player_over_exert(p,L'\x10',L'\x05',L'\x03');
    player_over_exert(p,L' ',L'\x05',L'\n');
  }
  _Var2 = monster_is_visible((monster *)mon);
  if (!_Var2) {
    _Var2 = monster_is_unique((monster *)mon);
    if (!_Var2) goto LAB_0017484e;
  }
  if (lore->pkills < 0x7fff) {
    lore->pkills = lore->pkills + 1;
  }
  if (lore->tkills < 0x7fff) {
    lore->tkills = lore->tkills + 1;
  }
  lore_update(mon->race,lore);
  monster_race_track(p->upkeep,mon->race);
LAB_0017484e:
  delete_monster_idx((chunk *)cave,mon->midx);
  return;
}

Assistant:

static void player_kill_monster(struct monster *mon, struct player *p,
		const char *note)
{
	int32_t div, new_exp, new_exp_frac;
	struct monster_lore *lore = get_lore(mon->race);
	char m_name[80];
	char buf[80];
	int desc_mode = MDESC_DEFAULT | ((note) ? MDESC_COMMA : 0);

	/* Assume normal death sound */
	int soundfx = MSG_KILL;

	/* Extract monster name */
	monster_desc(m_name, sizeof(m_name), mon, desc_mode);

	/* Shapechanged monsters revert on death */
	if (mon->original_race) {
		monster_revert_shape(mon);
		lore = get_lore(mon->race);
		monster_desc(m_name, sizeof(m_name), mon, desc_mode);
	}

	/* Play a special sound if the monster was unique */
	if (monster_is_unique(mon)) {
		if (mon->race->base == lookup_monster_base("Morgoth"))
			soundfx = MSG_KILL_KING;
		else
			soundfx = MSG_KILL_UNIQUE;
	}

	/* Death message */
	if (note) {
		if (strlen(note) <= 1) {
			/* Death by Spell attack - messages handled by project_m() */
		} else {
			/* Make sure to flush any monster messages first */
			notice_stuff(p);

			/* Death by Missile attack */
			my_strcap(m_name);
			msgt(soundfx, "%s%s", m_name, note);
		}
	} else {
		/* Make sure to flush any monster messages first */
		notice_stuff(p);

		if (!monster_is_visible(mon))
			/* Death by physical attack -- invisible monster */
			msgt(soundfx, "You have killed %s.", m_name);
		else if (monster_is_destroyed(mon))
			/* Death by Physical attack -- non-living monster */
			msgt(soundfx, "You have destroyed %s.", m_name);
		else
			/* Death by Physical attack -- living monster */
			msgt(soundfx, "You have slain %s.", m_name);
	}

	/* Player level */
	div = p->lev;

	/* Give some experience for the kill */
	new_exp = ((long)mon->race->mexp * mon->race->level) / div;

	/* Handle fractional experience */
	new_exp_frac = ((((long)mon->race->mexp * mon->race->level) % div)
					* 0x10000L / div) + p->exp_frac;

	/* Keep track of experience */
	if (new_exp_frac >= 0x10000L) {
		new_exp++;
		p->exp_frac = (uint16_t)(new_exp_frac - 0x10000L);
	} else {
		p->exp_frac = (uint16_t)new_exp_frac;
	}

	/* When the player kills a Unique, it stays dead */
	if (monster_is_unique(mon)) {
		char unique_name[80];
		assert(mon->original_race == NULL);
		mon->race->max_num = 0;

		/*
		 * This gets the correct name if we slay an invisible
		 * unique and don't have See Invisible.
		 */
		monster_desc(unique_name, sizeof(unique_name), mon,
					 MDESC_DIED_FROM);

		/* Log the slaying of a unique */
		strnfmt(buf, sizeof(buf), "Killed %s", unique_name);
		history_add(p, buf, HIST_SLAY_UNIQUE);
	}

	/* Gain experience */
	player_exp_gain(p, new_exp);

	/* Generate treasure */
	monster_death(mon, p, false);

	/* Bloodlust bonus */
	if (p->timed[TMD_BLOODLUST]) {
		player_inc_timed(p, TMD_BLOODLUST, 10, false, false, true);
		player_over_exert(p, PY_EXERT_CONF, 5, 3);
		player_over_exert(p, PY_EXERT_HALLU, 5, 10);
	}

	/* Recall even invisible uniques or winners */
	if (monster_is_visible(mon) || monster_is_unique(mon)) {
		/* Count kills this life */
		if (lore->pkills < SHRT_MAX) lore->pkills++;

		/* Count kills in all lives */
		if (lore->tkills < SHRT_MAX) lore->tkills++;

		/* Update lore and tracking */
		lore_update(mon->race, lore);
		monster_race_track(p->upkeep, mon->race);
	}

	/* Delete the monster */
	delete_monster_idx(cave, mon->midx);
}